

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

void mbedtls_ssl_read_version(int *major,int *minor,int transport,uchar *ver)

{
  uint uVar1;
  
  if (transport == 1) {
    *major = (byte)~*ver + 2;
    uVar1 = 2;
    if (ver[1] != 0xff) {
      uVar1 = (ver[1] ^ 0xff) + 1;
    }
  }
  else {
    *major = (uint)*ver;
    uVar1 = (uint)ver[1];
  }
  *minor = uVar1;
  return;
}

Assistant:

void mbedtls_ssl_read_version( int *major, int *minor, int transport,
                       const unsigned char ver[2] )
{
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        *major = 255 - ver[0] + 2;
        *minor = 255 - ver[1] + 1;

        if( *minor == MBEDTLS_SSL_MINOR_VERSION_1 )
            ++*minor; /* DTLS 1.0 stored as TLS 1.1 internally */
    }
    else
#else
    ((void) transport);
#endif
    {
        *major = ver[0];
        *minor = ver[1];
    }
}